

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_camera.c
# Opt level: O0

void add_vertex(double x,double y,double z,double u,double v,ALLEGRO_COLOR color)

{
  bool bVar1;
  ALLEGRO_VERTEX *pAVar2;
  int iVar3;
  ALLEGRO_VERTEX *pAVar4;
  int iVar5;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  int i;
  
  iVar3 = ex.n;
  iVar5 = ex.n + 1;
  bVar1 = ex.v_size <= ex.n;
  ex.n = iVar5;
  if (bVar1) {
    ex.v_size = (ex.v_size + 1) * 2;
    ex.v = (ALLEGRO_VERTEX *)realloc(ex.v,(long)ex.v_size * 0x24);
  }
  ex.v[iVar3].x = (float)in_XMM0_Qa;
  ex.v[iVar3].y = (float)in_XMM1_Qa;
  ex.v[iVar3].z = (float)in_XMM2_Qa;
  ex.v[iVar3].u = (float)in_XMM3_Qa;
  ex.v[iVar3].v = (float)in_XMM4_Qa;
  pAVar4 = ex.v;
  pAVar2 = ex.v + iVar3;
  (pAVar2->color).r = (float)(int)in_XMM5_Qa;
  (pAVar2->color).g = (float)(int)((ulong)in_XMM5_Qa >> 0x20);
  pAVar4[iVar3].color.b = (float)(int)in_XMM6_Qa;
  pAVar4[iVar3].color.a = (float)(int)((ulong)in_XMM6_Qa >> 0x20);
  return;
}

Assistant:

static void add_vertex(double x, double y, double z, double u, double v,
      ALLEGRO_COLOR color)
{
   int i = ex.n++;
   if (i >= ex.v_size) {
      ex.v_size += 1;
      ex.v_size *= 2;
      ex.v = realloc(ex.v, ex.v_size * sizeof *ex.v);
   }
   ex.v[i].x = x;
   ex.v[i].y = y;
   ex.v[i].z = z;
   ex.v[i].u = u;
   ex.v[i].v = v;
   ex.v[i].color = color;
}